

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::LivenessManager::GetComponentType
          (LivenessManager *this,uint32_t index,uint32_t agg_type_id)

{
  Op OVar1;
  uint32_t uVar2;
  DefUseManager *this_00;
  Instruction *this_01;
  
  this_00 = IRContext::get_def_use_mgr(this->ctx_);
  this_01 = DefUseManager::GetDef(this_00,agg_type_id);
  OVar1 = this_01->opcode_;
  uVar2 = 0;
  if (((1 < OVar1 - OpTypeVector) && (OVar1 != OpTypeArray)) &&
     (uVar2 = index, OVar1 != OpTypeStruct)) {
    __assert_fail("false && \"unexpected aggregate type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/liveness.cpp"
                  ,0x8c,
                  "uint32_t spvtools::opt::analysis::LivenessManager::GetComponentType(uint32_t, uint32_t) const"
                 );
  }
  uVar2 = Instruction::GetSingleWordInOperand(this_01,uVar2);
  return uVar2;
}

Assistant:

uint32_t LivenessManager::GetComponentType(uint32_t index,
                                           uint32_t agg_type_id) const {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  Instruction* agg_type_inst = def_use_mgr->GetDef(agg_type_id);

  const uint32_t kArrayElementInIdx = 0;
  switch (agg_type_inst->opcode()) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeVector:
      return agg_type_inst->GetSingleWordInOperand(kArrayElementInIdx);
    case spv::Op::OpTypeStruct:
      return agg_type_inst->GetSingleWordInOperand(index);
    default:
      assert(false && "unexpected aggregate type");
      return 0;
  }
}